

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

S2CellId __thiscall S2CellId::advance(S2CellId *this,int64 steps)

{
  ulong uVar1;
  int iVar2;
  S2CellId SVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (steps == 0) {
    SVar3 = (S2CellId)this->id_;
  }
  else {
    iVar2 = level(this);
    bVar4 = (char)iVar2 * -2 + 0x3d;
    uVar1 = this->id_;
    if (steps < 0) {
      uVar6 = uVar1 >> (bVar4 & 0x3f);
      uVar5 = -uVar6;
      if (-steps == uVar6 || (long)uVar5 < steps) {
        uVar5 = steps;
      }
    }
    else {
      uVar5 = 0xc000000000000000 - (uVar1 - 1 & uVar1) >> (bVar4 & 0x3f);
      if (steps <= (long)uVar5) {
        uVar5 = steps;
      }
    }
    SVar3.id_ = uVar1 + (uVar5 << (bVar4 & 0x3f));
  }
  return (S2CellId)SVar3.id_;
}

Assistant:

S2CellId S2CellId::advance(int64 steps) const {
  if (steps == 0) return *this;

  // We clamp the number of steps if necessary to ensure that we do not
  // advance past the End() or before the Begin() of this level.  Note that
  // min_steps and max_steps always fit in a signed 64-bit integer.

  int step_shift = 2 * (kMaxLevel - level()) + 1;
  if (steps < 0) {
    int64 min_steps = -static_cast<int64>(id_ >> step_shift);
    if (steps < min_steps) steps = min_steps;
  } else {
    int64 max_steps = (kWrapOffset + lsb() - id_) >> step_shift;
    if (steps > max_steps) steps = max_steps;
  }
  // If steps is negative, then shifting it left has undefined behavior.
  // Cast to uint64 for a 2's complement answer.
  return S2CellId(id_ + (static_cast<uint64>(steps) << step_shift));
}